

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_ReadFunctionBytecode
              (BCReaderState *s,JSFunctionBytecode *b,int byte_code_offset,uint32_t bc_len)

{
  byte bVar1;
  uint uVar2;
  JSAtomStruct *pJVar3;
  int iVar4;
  uint uVar5;
  uint8_t *buf;
  JSAtom atom;
  JSAtom local_3c;
  JSFunctionBytecode *local_38;
  
  if (s->field_0x36 == '\0') {
    buf = (uint8_t *)((long)&(b->header).ref_count + (long)byte_code_offset);
    iVar4 = bc_get_buf(s,buf,bc_len);
    if (iVar4 != 0) {
      return -1;
    }
  }
  else {
    buf = s->ptr;
    if ((long)s->buf_end - (long)buf < (long)(ulong)bc_len) {
      JS_ReadFunctionBytecode_cold_1();
      return -1;
    }
    s->ptr = buf + bc_len;
  }
  b->byte_code_buf = buf;
  if (bc_len != 0) {
    uVar5 = 0;
    local_38 = b;
    do {
      bVar1 = buf[uVar5];
      uVar2 = bVar1 + 0xf;
      if (bVar1 < 0xb2) {
        uVar2 = (uint)bVar1;
      }
      bVar1 = opcode_info[uVar2].size;
      if ((byte)(opcode_info[uVar2].fmt - 0x17) < 5) {
        uVar2 = *(uint *)(buf + (ulong)uVar5 + 1);
        if (s->field_0x36 == '\0') {
          iVar4 = bc_idx_to_atom(s,&local_3c,uVar2);
          if (iVar4 != 0) {
            local_38->byte_code_len = uVar5;
            return -1;
          }
          *(JSAtom *)(buf + (ulong)uVar5 + 1) = local_3c;
        }
        else if (0xd1 < (int)uVar2) {
          pJVar3 = s->ctx->rt->atom_array[uVar2];
          (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
        }
      }
      uVar5 = uVar5 + bVar1;
    } while (uVar5 < bc_len);
  }
  return 0;
}

Assistant:

static int JS_ReadFunctionBytecode(BCReaderState *s, JSFunctionBytecode *b,
                                   int byte_code_offset, uint32_t bc_len)
{
    uint8_t *bc_buf;
    int pos, len, op;
    JSAtom atom;
    uint32_t idx;

    if (s->is_rom_data) {
        /* directly use the input buffer */
        if (unlikely(s->buf_end - s->ptr < bc_len))
            return bc_read_error_end(s);
        bc_buf = (uint8_t *)s->ptr;
        s->ptr += bc_len;
    } else {
        bc_buf = (void *)((uint8_t*)b + byte_code_offset);
        if (bc_get_buf(s, bc_buf, bc_len))
            return -1;
    }
    b->byte_code_buf = bc_buf;

    pos = 0;
    while (pos < bc_len) {
        op = bc_buf[pos];
        len = short_opcode_info(op).size;
        switch(short_opcode_info(op).fmt) {
        case OP_FMT_atom:
        case OP_FMT_atom_u8:
        case OP_FMT_atom_u16:
        case OP_FMT_atom_label_u8:
        case OP_FMT_atom_label_u16:
            idx = get_u32(bc_buf + pos + 1);
            if (s->is_rom_data) {
                /* just increment the reference count of the atom */
                JS_DupAtom(s->ctx, (JSAtom)idx);
            } else {
                if (bc_idx_to_atom(s, &atom, idx)) {
                    /* Note: the atoms will be freed up to this position */
                    b->byte_code_len = pos;
                    return -1;
                }
                put_u32(bc_buf + pos + 1, atom);
#ifdef DUMP_READ_OBJECT
                bc_read_trace(s, "at %d, fixup atom: ", pos + 1); print_atom(s->ctx, atom); printf("\n");
#endif
            }
            break;
        default:
            break;
        }
        pos += len;
    }
    return 0;
}